

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O2

string * __thiscall
aeron::archive::ChannelUri::toString_abi_cxx11_(string *__return_storage_ptr__,ChannelUri *this)

{
  ostream *poVar1;
  char *pcVar2;
  size_type sVar3;
  __node_base *p_Var4;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  if ((this->prefix_)._M_string_length != 0) {
    std::operator<<((ostream *)&ss,(string *)this);
    if ((this->prefix_)._M_dataplus._M_p[(this->prefix_)._M_string_length - 1] != ':') {
      std::operator<<((ostream *)&ss,':');
    }
  }
  poVar1 = std::operator<<((ostream *)&ss,(string *)(anonymous_namespace)::AERON_PREFIX_abi_cxx11_);
  std::operator<<(poVar1,(string *)&this->media_);
  if ((this->params_)._M_h._M_element_count != 0) {
    std::operator<<((ostream *)&ss,'?');
    sVar3 = (this->params_)._M_h._M_element_count;
    p_Var4 = &(this->params_)._M_h._M_before_begin;
    while( true ) {
      sVar3 = sVar3 - 1;
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (__node_base *)0x0) break;
      poVar1 = std::operator<<((ostream *)&ss,(string *)(p_Var4 + 1));
      poVar1 = std::operator<<(poVar1,'=');
      poVar1 = std::operator<<(poVar1,(string *)(p_Var4 + 5));
      pcVar2 = "|";
      if (sVar3 == 0) {
        pcVar2 = "";
      }
      std::operator<<(poVar1,pcVar2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelUri::toString() const {
    std::ostringstream ss;

    if (!prefix_.empty()) {
        ss << prefix_;
        if (':' != *prefix_.rbegin()) {
            ss << ':';
        }
    }

    ss << AERON_PREFIX << media_;

    if (!params_.empty()) {
        ss << '?';

        std::size_t ps = params_.size();

        for (const auto& p : params_) {
            ss << p.first << '=' << p.second << (--ps ? "|" : "");
        }
    }

    return ss.str();
}